

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_light
          (NodeLoader *this,instance_light__AttributeData *attributeData)

{
  Node *pNVar1;
  _Elt_pointer ppNVar2;
  UniqueId *pUVar3;
  UniqueId instantiatedLightUniqueId;
  UniqueId instanceLightUniqueId;
  InstanceLight *instanceLight;
  
  ppNVar2 = (this->mNodeStack).c.
            super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppNVar2 ==
      (this->mNodeStack).c.super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppNVar2 = (this->mNodeStack).c.
              super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pNVar1 = ppNVar2[-1];
  pUVar3 = IFilePartLoader::createUniqueIdFromUrl
                     (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                       super_IFilePartLoader,&attributeData->url,LIGHT,false);
  instantiatedLightUniqueId.mClassId = pUVar3->mClassId;
  instantiatedLightUniqueId._4_4_ = *(undefined4 *)&pUVar3->field_0x4;
  instantiatedLightUniqueId.mObjectId = pUVar3->mObjectId;
  instantiatedLightUniqueId.mFileId = pUVar3->mFileId;
  IFilePartLoader::createUniqueId
            (&instanceLightUniqueId,
             &((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             INSTANCE_LIGHT);
  instanceLight = (InstanceLight *)operator_new(0x58);
  (instanceLight->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)438>).mUniqueId.mFileId =
       instanceLightUniqueId.mFileId;
  (instanceLight->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)438>).mUniqueId.mClassId =
       instanceLightUniqueId.mClassId;
  *(undefined4 *)
   &(instanceLight->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)438>).mUniqueId.field_0x4
       = instanceLightUniqueId._4_4_;
  (instanceLight->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)438>).mUniqueId.mObjectId =
       instanceLightUniqueId.mObjectId;
  (instanceLight->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)438>).super_Object.
  _vptr_Object = (_func_int **)&PTR__InstanceBase_00a039f8;
  (instanceLight->mName)._M_dataplus._M_p = (pointer)&(instanceLight->mName).field_2;
  (instanceLight->mName)._M_string_length = 0;
  (instanceLight->mName).field_2._M_local_buf[0] = '\0';
  (instanceLight->mInstanciatedObjectId).mClassId = instantiatedLightUniqueId.mClassId;
  *(undefined4 *)&(instanceLight->mInstanciatedObjectId).field_0x4 = instantiatedLightUniqueId._4_4_
  ;
  (instanceLight->mInstanciatedObjectId).mObjectId = instantiatedLightUniqueId.mObjectId;
  (instanceLight->mInstanciatedObjectId).mFileId = instantiatedLightUniqueId.mFileId;
  COLLADAFW::ArrayPrimitiveType<COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)438>_*>::
  append(&(pNVar1->mInstanceLights).
          super_ArrayPrimitiveType<COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)438>_*>
         ,&instanceLight);
  COLLADAFW::UniqueId::~UniqueId(&instanceLightUniqueId);
  COLLADAFW::UniqueId::~UniqueId(&instantiatedLightUniqueId);
  return true;
}

Assistant:

bool NodeLoader::begin__instance_light( const instance_light__AttributeData& attributeData )
	{
		COLLADAFW::Node* currentNode = mNodeStack.top();
		COLLADAFW::UniqueId instantiatedLightUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl( attributeData.url, COLLADAFW::Light::ID() );

        COLLADAFW::UniqueId instanceLightUniqueId = getHandlingFilePartLoader()->createUniqueId( COLLADAFW::InstanceLight::ID() );
		COLLADAFW::InstanceLight* instanceLight = FW_NEW COLLADAFW::InstanceLight(instanceLightUniqueId, instantiatedLightUniqueId);
		currentNode->getInstanceLights().append(instanceLight);

		return true;
	}